

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O1

GLFWbool openJoystickDevice(char *path)

{
  int iVar1;
  int iVar2;
  _GLFWjoylistLinux *p_Var3;
  ulong uVar4;
  char *pcVar5;
  float *pfVar6;
  uchar *puVar7;
  long lVar8;
  ulong uVar9;
  GLFWbool GVar10;
  char local_138 [8];
  char name [256];
  int version;
  char axisCount;
  char buttonCount;
  
  lVar8 = 0;
  memset(local_138,0,0x100);
  do {
    if (*(int *)((long)&_glfw.linux_js.js[0].present + lVar8) != 0) {
      iVar1 = strcmp(*(char **)((long)&_glfw.linux_js.js[0].path + lVar8),path);
      if (iVar1 == 0) goto LAB_001325a3;
    }
    lVar8 = lVar8 + 0x38;
  } while (lVar8 != 0x380);
  p_Var3 = &_glfw.linux_js;
  uVar9 = 0;
  do {
    if (p_Var3->js[0].present == 0) goto LAB_0013259e;
    uVar9 = uVar9 + 1;
    p_Var3 = (_GLFWjoylistLinux *)(p_Var3->js + 1);
  } while (uVar9 != 0x10);
  uVar9 = 0x10;
LAB_0013259e:
  if ((uint)uVar9 < 0x10) {
    GVar10 = 0;
    iVar1 = open(path,0x800);
    if (iVar1 != -1) {
      GVar10 = 0;
      ioctl(iVar1,0x80046a01,name + 0xf8);
      if ((int)name._248_4_ < 0x10000) {
        close(iVar1);
      }
      else {
        iVar2 = ioctl(iVar1,0x81006a13,local_138);
        if (iVar2 < 0) {
          strncpy(local_138,"Unknown",0x100);
        }
        uVar4 = uVar9 & 0xffffffff;
        _glfw.linux_js.js[uVar4].present = 1;
        pcVar5 = strdup(local_138);
        _glfw.linux_js.js[uVar4].name = pcVar5;
        pcVar5 = strdup(path);
        _glfw.linux_js.js[uVar4].path = pcVar5;
        _glfw.linux_js.js[uVar4].fd = iVar1;
        ioctl(iVar1,0x80016a11,name + 0xfe);
        _glfw.linux_js.js[uVar4].axisCount = (int)name[0xfe];
        pfVar6 = (float *)calloc((long)name[0xfe],4);
        _glfw.linux_js.js[uVar4].axes = pfVar6;
        ioctl(iVar1,0x80016a12,name + 0xff);
        _glfw.linux_js.js[uVar4].buttonCount = (int)name[0xff];
        puVar7 = (uchar *)calloc((long)name[0xff],1);
        _glfw.linux_js.js[uVar4].buttons = puVar7;
        _glfwInputJoystickChange((uint)uVar9,0x40001);
        GVar10 = 1;
      }
    }
  }
  else {
LAB_001325a3:
    GVar10 = 0;
  }
  return GVar10;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    char axisCount, buttonCount;
    char name[256] = "";
    int joy, fd, version;
    _GLFWjoystickLinux* js;

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            continue;

        if (strcmp(_glfw.linux_js.js[joy].path, path) == 0)
            return GLFW_FALSE;
    }

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            break;
    }

    if (joy > GLFW_JOYSTICK_LAST)
        return GLFW_FALSE;

    fd = open(path, O_RDONLY | O_NONBLOCK);
    if (fd == -1)
        return GLFW_FALSE;

    // Verify that the joystick driver version is at least 1.0
    ioctl(fd, JSIOCGVERSION, &version);
    if (version < 0x010000)
    {
        // It's an old 0.x interface (we don't support it)
        close(fd);
        return GLFW_FALSE;
    }

    if (ioctl(fd, JSIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    js = _glfw.linux_js.js + joy;
    js->present = GLFW_TRUE;
    js->name = strdup(name);
    js->path = strdup(path);
    js->fd = fd;

    ioctl(fd, JSIOCGAXES, &axisCount);
    js->axisCount = (int) axisCount;
    js->axes = calloc(axisCount, sizeof(float));

    ioctl(fd, JSIOCGBUTTONS, &buttonCount);
    js->buttonCount = (int) buttonCount;
    js->buttons = calloc(buttonCount, 1);

    _glfwInputJoystickChange(joy, GLFW_CONNECTED);
    return GLFW_TRUE;
}